

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_sequence_insert_prepare(fy_node *fyn_seq,fy_node *fyn)

{
  fy_document *fyd;
  fy_node *fyn_local;
  fy_node *fyn_seq_local;
  
  if (((fyn_seq == (fy_node *)0x0) || (fyn == (fy_node *)0x0)) || ((fyn_seq->field_0x34 & 3) != 1))
  {
    fyn_seq_local._4_4_ = -1;
  }
  else if (((byte)fyn->field_0x34 >> 3 & 1) == 0) {
    if (fyn_seq->fyd == (fy_document *)0x0) {
      fyn_seq_local._4_4_ = -1;
    }
    else if (fyn->fyd == fyn_seq->fyd) {
      fyn->parent = fyn_seq;
      fyn_seq_local._4_4_ = 0;
    }
    else {
      fyn_seq_local._4_4_ = -1;
    }
  }
  else {
    fyn_seq_local._4_4_ = -1;
  }
  return fyn_seq_local._4_4_;
}

Assistant:

static int fy_node_sequence_insert_prepare(struct fy_node *fyn_seq, struct fy_node *fyn) {
    struct fy_document *fyd;

    if (!fyn_seq || !fyn || fyn_seq->type != FYNT_SEQUENCE)
        return -1;

    /* can't insert a node that's attached already */
    if (fyn->attached)
        return -1;

    /* a document must be associated with the sequence */
    fyd = fyn_seq->fyd;
    if (!fyd)
        return -1;

    /* the documents of the nodes must match */
    if (fyn->fyd != fyd)
        return -1;

    fyn->parent = fyn_seq;

    return 0;
}